

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

int OSSL_HTTP_REQ_CTX_set_request_line
              (OSSL_HTTP_REQ_CTX *rctx,int method_POST,char *server,char *port,char *path)

{
  int iVar1;
  BIO_METHOD *type;
  BIO *pBVar2;
  long in_RCX;
  char *in_RDX;
  char *pcVar3;
  int in_ESI;
  undefined4 *in_RDI;
  char *in_R8;
  int local_4;
  
  if (in_RDI == (undefined4 *)0x0) {
    ERR_new();
    ERR_set_debug(in_RDX,(int)((ulong)in_RCX >> 0x20),in_R8);
    ERR_set_error(0x3d,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    BIO_free(*(BIO **)(in_RDI + 0x16));
    type = BIO_s_mem();
    pBVar2 = BIO_new(type);
    *(BIO **)(in_RDI + 0x16) = pBVar2;
    if (pBVar2 == (BIO *)0x0) {
      local_4 = 0;
    }
    else {
      in_RDI[0x1a] = (uint)(in_ESI != 0);
      pcVar3 = "GET";
      if (in_RDI[0x1a] != 0) {
        pcVar3 = "POST";
      }
      iVar1 = BIO_printf(*(BIO **)(in_RDI + 0x16),"%s ",pcVar3);
      if (iVar1 < 1) {
        local_4 = 0;
      }
      else {
        if (in_RDX != (char *)0x0) {
          iVar1 = BIO_printf(*(BIO **)(in_RDI + 0x16),"http://%s",in_RDX);
          if (iVar1 < 1) {
            return 0;
          }
          if ((in_RCX != 0) &&
             (iVar1 = BIO_printf(*(BIO **)(in_RDI + 0x16),":%s",in_RCX), iVar1 < 1)) {
            return 0;
          }
        }
        if (in_R8 == (char *)0x0) {
          in_R8 = "/";
        }
        if ((*in_R8 == '/') || (iVar1 = BIO_printf(*(BIO **)(in_RDI + 0x16),"/"), 0 < iVar1)) {
          iVar1 = BIO_printf(*(BIO **)(in_RDI + 0x16),"%s HTTP/1.0\r\n",in_R8);
          if (iVar1 < 1) {
            local_4 = 0;
          }
          else {
            *(undefined8 *)(in_RDI + 0x24) = 0;
            *in_RDI = 0x1001;
            local_4 = 1;
          }
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int OSSL_HTTP_REQ_CTX_set_request_line(OSSL_HTTP_REQ_CTX *rctx, int method_POST,
                                       const char *server, const char *port,
                                       const char *path)
{
    if (rctx == NULL) {
        ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }
    BIO_free(rctx->mem);
    if ((rctx->mem = BIO_new(BIO_s_mem())) == NULL)
        return 0;

    rctx->method_POST = method_POST != 0;
    if (BIO_printf(rctx->mem, "%s ", rctx->method_POST ? "POST" : "GET") <= 0)
        return 0;

    if (server != NULL) { /* HTTP (but not HTTPS) proxy is used */
        /*
         * Section 5.1.2 of RFC 1945 states that the absoluteURI form is only
         * allowed when using a proxy
         */
        if (BIO_printf(rctx->mem, OSSL_HTTP_PREFIX"%s", server) <= 0)
            return 0;
        if (port != NULL && BIO_printf(rctx->mem, ":%s", port) <= 0)
            return 0;
    }

    /* Make sure path includes a forward slash */
    if (path == NULL)
        path = "/";
    if (path[0] != '/' && BIO_printf(rctx->mem, "/") <= 0)
        return 0;
    /*
     * Add (the rest of) the path and the HTTP version,
     * which is fixed to 1.0 for straightforward implementation of keep-alive
     */
    if (BIO_printf(rctx->mem, "%s "HTTP_1_0"\r\n", path) <= 0)
        return 0;

    rctx->resp_len = 0;
    rctx->state = OHS_ADD_HEADERS;
    return 1;
}